

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O0

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  ulong in_RCX;
  long in_RDX;
  char *in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  bool bVar10;
  long in_stack_00000008;
  int *in_stack_00000010;
  ulong *in_stack_00000018;
  undefined4 *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  int delayed_backward_references_in_row;
  uint8_t p2;
  uint8_t p1;
  int dict_id;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H2 *privat;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  uint32_t delta;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_3;
  uint16_t bits64;
  size_t score_4;
  size_t len_3;
  size_t backward_2;
  size_t score_3;
  size_t len_2;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t key_2;
  int compare_char_1;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t matching_bits_4;
  uint64_t x_4;
  uint8_t *s1_orig_4;
  size_t matching_bits_3;
  uint64_t x_3;
  uint8_t *s1_orig_3;
  int item_matches_1;
  size_t i_1;
  size_t key_3;
  uint64_t t_8;
  uint64_t t_7;
  uint64_t t_10;
  uint64_t t_9;
  uint32_t h_1;
  uint32_t t_11;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_3;
  size_t matchlen_1;
  size_t offset_1;
  size_t matching_bits_5;
  uint64_t x_5;
  uint8_t *s1_orig_5;
  uint64_t t_13;
  uint64_t t_12;
  size_t score_1;
  size_t len_1;
  size_t backward;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t matching_bits_1;
  uint64_t x_1;
  uint8_t *s1_orig_1;
  size_t matching_bits;
  uint64_t x;
  uint8_t *s1_orig;
  int item_matches;
  size_t i;
  size_t key_1;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_3;
  uint64_t t_2;
  uint32_t h;
  uint32_t t_4;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_1;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_2;
  uint64_t x_2;
  uint8_t *s1_orig_2;
  uint64_t t_6;
  uint64_t t_5;
  size_t i_2;
  uint32_t key_4;
  uint32_t key_6;
  uint32_t key_5;
  char *local_ae8;
  char *local_ad8;
  char *local_ac8;
  char *local_ac0;
  char *local_ab0;
  char *local_a98;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a18;
  char *local_a08;
  char *local_a00;
  ulong local_9f8;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined8 local_9e8;
  int local_9dc;
  byte local_9d6;
  byte local_9d5;
  uint local_9d4;
  char *local_9d0;
  char *local_9c8;
  ulong local_9c0;
  ulong local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined8 local_998;
  long local_990;
  char *local_988;
  long local_980;
  char *local_978;
  char *local_970;
  ulong local_968;
  undefined4 *local_960;
  long local_958;
  char *local_950;
  long *local_948;
  long local_940;
  long local_938;
  ulong local_930;
  long local_928;
  char *local_920;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  ulong local_868;
  ulong local_860;
  char *local_858;
  char *local_848;
  char *local_840;
  char *local_838;
  uint local_82c;
  char *local_828;
  uint local_81c;
  char *local_818;
  ulong local_810;
  uint *local_808;
  undefined4 *local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  char *local_7d8;
  char *local_7d0;
  long local_7c8;
  long local_7c0;
  ulong local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  char *local_798;
  undefined4 *local_790;
  ushort *local_788;
  ulong local_780;
  ulong local_778;
  char *local_770;
  char *local_768;
  ushort local_75c;
  ushort local_75a;
  ushort *local_758;
  uint local_74c;
  ulong local_748;
  ulong local_740;
  int local_734;
  ulong local_730;
  ushort local_722;
  long local_720;
  long local_718;
  int local_70c;
  ulong local_708;
  ushort local_6fa;
  long local_6f8;
  long local_6f0;
  int local_6e4;
  ushort local_6de;
  uint local_6dc;
  ushort local_6d6;
  ushort local_6d4;
  ushort local_6d2;
  long *local_6c8;
  long *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  ulong local_660;
  uint local_654;
  ulong local_650;
  char *local_648;
  long local_640;
  char **local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  int *local_608;
  ulong local_600;
  long local_5f8;
  long *local_5f0;
  long *local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  ulong *local_5d0;
  char *local_5c8;
  ulong *local_5c0;
  ulong *local_5b8;
  char *local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  ulong *local_598;
  char *local_590;
  ulong *local_588;
  ulong *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  int local_554;
  ulong local_550;
  ulong local_548;
  int local_53c;
  char **local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  ulong *local_518;
  long local_510;
  long *local_508;
  ulong local_500;
  ulong *local_4f8;
  ulong local_4f0;
  ulong *local_4e8;
  ulong local_4e0;
  ulong *local_4d8;
  ulong local_4d0;
  ulong *local_4c8;
  char *local_4c0;
  uint local_4b4;
  ulong *local_4b0;
  int local_4a4;
  ulong *local_4a0;
  long local_498;
  long local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  long local_470;
  char **local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  ulong *local_448;
  ulong local_440;
  char *local_438;
  long *local_430;
  int local_424;
  ulong local_420;
  ulong local_418;
  ulong *local_410;
  char *local_408;
  ulong *local_400;
  ulong *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  ulong local_3d8;
  ulong *local_3d0;
  ulong local_3c8;
  ulong *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  long local_378;
  char *local_370;
  char *local_368;
  ulong local_360;
  uint local_354;
  ulong local_350;
  long local_348;
  long local_340;
  char **local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  int *local_308;
  ulong local_300;
  long local_2f8;
  long *local_2f0;
  long *local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong *local_2d0;
  char *local_2c8;
  ulong *local_2c0;
  ulong *local_2b8;
  char *local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong *local_298;
  char *local_290;
  ulong *local_288;
  ulong *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  int local_254;
  ulong local_250;
  ulong local_248;
  int local_23c;
  char **local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ulong *local_218;
  long local_210;
  long *local_208;
  ulong local_200;
  ulong *local_1f8;
  ulong local_1f0;
  ulong *local_1e8;
  ulong local_1e0;
  ulong *local_1d8;
  ulong local_1d0;
  ulong *local_1c8;
  char *local_1c0;
  uint local_1b4;
  ulong *local_1b0;
  int local_1a4;
  ulong *local_1a0;
  long local_198;
  long local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  long local_170;
  char **local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  ulong *local_148;
  ulong local_140;
  char *local_138;
  long *local_130;
  int local_124;
  ulong local_120;
  ulong local_118;
  ulong *local_110;
  char *local_108;
  ulong *local_100;
  ulong *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  ulong local_d8;
  ulong *local_d0;
  ulong local_c8;
  ulong *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  ulong local_98;
  long local_90;
  long *local_88;
  uint32_t local_7c;
  char *local_78;
  ulong local_70;
  long local_68;
  long *local_60;
  uint32_t local_54;
  char *local_50;
  ulong local_48;
  long local_40;
  long *local_38;
  uint32_t local_2c;
  char *local_28;
  ulong local_20;
  long local_18;
  long *local_10;
  
  local_948 = (long *)(in_stack_00000008 + 0x50);
  local_950 = (char *)((1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) + -0x10);
  local_958 = *(long *)(in_R9 + 0x10);
  local_960 = in_stack_00000020;
  local_968 = *in_stack_00000018;
  local_970 = in_RSI + in_RDI;
  local_a48 = in_RSI;
  if (7 < in_RDI) {
    local_a48 = in_RSI + (in_RDI - 7);
  }
  local_978 = local_a48;
  iVar4 = 0x200;
  if (*(int *)(in_R9 + 4) < 9) {
    iVar4 = 0x40;
  }
  local_980 = (long)iVar4;
  local_988 = in_RSI + local_980;
  local_990 = *(long *)(in_R9 + 0x60);
  local_998 = 0x7e4;
  local_940 = in_R9;
  local_938 = in_R8;
  local_930 = in_RCX;
  local_928 = in_RDX;
  pcVar6 = in_RSI;
  local_6b8 = local_948;
LAB_0237abf6:
  do {
    local_920 = pcVar6;
    if (local_970 <= local_920 + 8) {
      *in_stack_00000018 = (ulong)(local_970 + (local_968 - (long)local_920));
      *in_stack_00000028 = ((long)in_stack_00000020 - (long)local_960 >> 4) + *in_stack_00000028;
      return;
    }
    local_9a0 = local_970 + -(long)local_920;
    local_870 = local_920;
    local_878 = local_950;
    if (local_920 < local_950) {
      local_a50 = local_920;
    }
    else {
      local_a50 = local_950;
    }
    local_9a8 = local_a50;
    local_880 = local_920 + local_958;
    local_888 = local_950;
    local_a58 = local_880;
    if (local_950 <= local_880) {
      local_a58 = local_950;
    }
    local_9b0 = local_a58;
    local_9d4 = 0;
    local_9d5 = 0;
    local_9d6 = 0;
    if (*(int *)(local_940 + 0x270) != 0) {
      if (local_920 == (char *)0x0) {
        local_9d5 = 0;
      }
      else {
        local_9d5 = *(byte *)(local_928 + ((ulong)(local_920 + -1) & local_930));
      }
      if (local_920 < (char *)0x2) {
        local_9d6 = 0;
      }
      else {
        local_9d6 = *(byte *)(local_928 + ((ulong)(local_920 + -2) & local_930));
      }
      local_9d4 = (uint)*(byte *)(local_940 + 0x275 +
                                 (long)(int)(uint)(*(byte *)(local_938 + (ulong)local_9d5) |
                                                  *(byte *)(local_938 + 0x100 + (ulong)local_9d6)));
    }
    local_9d0 = (char *)0x0;
    local_9b8 = local_9b8 & 0xffffffff00000000;
    local_9c8 = (char *)0x0;
    local_9c0 = 0x7e4;
    local_2f0 = *(long **)(local_940 + 0x2b8 + (long)(int)local_9d4 * 8);
    local_328 = local_a58 + local_990;
    local_330 = *(char **)(local_940 + 0x48);
    local_2e8 = local_948;
    local_2f8 = local_928;
    local_300 = local_930;
    local_308 = in_stack_00000010;
    local_310 = local_920;
    local_320 = local_a50;
    local_338 = &local_9d0;
    local_340 = local_948[1];
    local_348 = 0;
    local_350 = (ulong)local_920 & local_930;
    local_354 = (uint)*(byte *)(local_928 + local_350);
    local_318 = local_9a0;
    uVar3 = duckdb_brotli::HashBytesH2((uint8_t *)(local_928 + local_350));
    local_360 = (ulong)uVar3;
    local_368 = local_338[2];
    local_370 = local_338[2];
    local_378 = local_348;
    local_380 = (char *)(long)*local_308;
    local_388 = local_310 + -(long)local_380;
    *(undefined4 *)(local_338 + 3) = 0;
    if ((local_388 < local_310) &&
       (local_388 = (char *)(local_300 & 0xffffffff & (ulong)local_388),
       local_354 == *(byte *)(local_2f8 + (long)local_388 + local_378))) {
      local_298 = (ulong *)(local_2f8 + (long)local_388);
      local_288 = (ulong *)(local_2f8 + local_350);
      local_290 = local_318;
      local_280 = local_298;
LAB_0237b0a3:
      if (local_290 < (char *)0x8) {
        while( true ) {
          bVar10 = false;
          if (local_290 != (char *)0x0) {
            bVar10 = (char)*local_280 == (char)*local_288;
          }
          if (!bVar10) break;
          local_290 = local_290 + -1;
          local_288 = (ulong *)((long)local_288 + 1);
          local_280 = (ulong *)((long)local_280 + 1);
        }
        local_278 = (char *)((long)local_280 - (long)local_298);
      }
      else {
        local_1e8 = local_288;
        local_1f0 = *local_288;
        local_1f8 = local_280;
        local_200 = *local_280;
        local_2a0 = local_1f0 ^ local_200;
        local_288 = local_288 + 1;
        if (local_2a0 == 0) break;
        iVar4 = 0;
        for (uVar5 = local_2a0; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
          iVar4 = iVar4 + 1;
        }
        local_2a8 = (ulong)iVar4;
        local_278 = (char *)((long)local_280 + ((local_2a8 >> 3) - (long)local_298));
      }
      local_390 = local_278;
      if (local_278 < (char *)0x4) goto LAB_0237b305;
      local_270 = local_278;
      local_398 = (char *)((long)local_278 * 0x87 + 0x78f);
      if (local_398 <= local_370) goto LAB_0237b305;
      *local_338 = local_278;
      local_338[1] = local_380;
      local_338[2] = local_398;
      *(int *)(local_340 + local_360 * 4) = (int)local_310;
    }
    else {
LAB_0237b305:
      uVar5 = (ulong)*(uint *)(local_340 + local_360 * 4);
      *(int *)(local_340 + local_360 * 4) = (int)local_310;
      local_3a0 = local_310 + -uVar5;
      local_388 = (char *)(local_300 & 0xffffffff & uVar5);
      if ((local_354 == *(byte *)(local_2f8 + (long)local_388 + local_348)) &&
         (local_3a0 != (char *)0x0 && local_3a0 <= local_320)) {
        local_2d0 = (ulong *)(local_2f8 + (long)local_388);
        local_2c0 = (ulong *)(local_2f8 + local_350);
        local_2c8 = local_318;
        local_2b8 = local_2d0;
LAB_0237b42b:
        if (local_2c8 < (char *)0x8) {
          while( true ) {
            bVar10 = false;
            if (local_2c8 != (char *)0x0) {
              bVar10 = (char)*local_2b8 == (char)*local_2c0;
            }
            if (!bVar10) break;
            local_2c8 = local_2c8 + -1;
            local_2c0 = (ulong *)((long)local_2c0 + 1);
            local_2b8 = (ulong *)((long)local_2b8 + 1);
          }
          local_2b0 = (char *)((long)local_2b8 - (long)local_2d0);
        }
        else {
          local_1c8 = local_2c0;
          local_1d0 = *local_2c0;
          local_1d8 = local_2b8;
          local_1e0 = *local_2b8;
          local_2d8 = local_1d0 ^ local_1e0;
          local_2c0 = local_2c0 + 1;
          if (local_2d8 == 0) goto LAB_0237b4fd;
          iVar4 = 0;
          for (uVar5 = local_2d8; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_2e0 = (ulong)iVar4;
          local_2b0 = (char *)((long)local_2b8 + ((local_2e0 >> 3) - (long)local_2d0));
        }
        local_3a8 = local_2b0;
        if ((char *)0x3 < local_2b0) {
          local_260 = local_2b0;
          iVar4 = 0x1f;
          if ((uint)local_3a0 != 0) {
            for (; (uint)local_3a0 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          local_3b0 = (char *)(((long)local_2b0 * 0x87 + 0x780) - (ulong)(uint)(iVar4 * 0x1e));
          local_268 = local_3a0;
          local_1c0 = local_3a0;
          if (local_370 < local_3b0) {
            *local_338 = local_2b0;
            local_338[1] = local_3a0;
            local_338[2] = local_3b0;
            goto LAB_0237bd61;
          }
        }
        if (local_368 == local_338[2]) {
          local_210 = *local_2e8;
          local_218 = (ulong *)(local_2f8 + local_350);
          local_208 = local_2f0;
          local_220 = local_318;
          local_228 = local_328;
          local_230 = local_330;
          local_238 = local_338;
          local_23c = 1;
          if (*(ulong *)(local_210 + 0x28) >> 7 <= *(ulong *)(local_210 + 0x30)) {
            local_1a4 = (int)*local_218;
            local_1b4 = local_1a4 * 0x1e35a7bd;
            local_248 = (ulong)((local_1b4 >> 0x12) << 1);
            local_250 = 0;
            local_1b0 = local_218;
            local_1a0 = local_218;
            while( true ) {
              uVar9 = 2;
              if (local_23c != 0) {
                uVar9 = 1;
              }
              if (uVar9 <= local_250) break;
              *(long *)(local_210 + 0x28) = *(long *)(local_210 + 0x28) + 1;
              if (*(char *)(local_208[4] + local_248) != '\0') {
                local_138 = (char *)(ulong)*(byte *)(local_208[4] + local_248);
                local_140 = (ulong)*(ushort *)(local_208[3] + local_248 * 2);
                local_130 = local_208;
                local_148 = local_218;
                local_150 = local_220;
                local_158 = local_228;
                local_160 = local_230;
                local_168 = local_238;
                local_170 = (ulong)*(uint *)(*local_208 + 0x20 + (long)local_138 * 4) +
                            (long)local_138 * local_140;
                if (local_220 < local_138) {
                  local_124 = 0;
                }
                else {
                  local_100 = (ulong *)(*(long *)(*local_208 + 0xa8) + local_170);
                  local_f8 = local_218;
                  local_110 = local_218;
                  local_108 = local_138;
LAB_0237b978:
                  if (local_108 < (char *)0x8) {
                    while( true ) {
                      bVar10 = false;
                      if (local_108 != (char *)0x0) {
                        bVar10 = (char)*local_f8 == (char)*local_100;
                      }
                      if (!bVar10) break;
                      local_108 = local_108 + -1;
                      local_100 = (ulong *)((long)local_100 + 1);
                      local_f8 = (ulong *)((long)local_f8 + 1);
                    }
                    local_f0 = (char *)((long)local_f8 - (long)local_218);
                  }
                  else {
                    local_c0 = local_100;
                    local_c8 = *local_100;
                    local_d0 = local_f8;
                    local_d8 = *local_f8;
                    local_118 = local_c8 ^ local_d8;
                    local_100 = local_100 + 1;
                    if (local_118 == 0) goto LAB_0237ba4a;
                    iVar4 = 0;
                    for (uVar5 = local_118; (uVar5 & 1) == 0;
                        uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                      iVar4 = iVar4 + 1;
                    }
                    local_120 = (ulong)iVar4;
                    local_f0 = (char *)((long)local_f8 + ((local_120 >> 3) - (long)local_218));
                  }
                  local_178 = local_f0;
                  if ((local_138 < local_f0 + *(uint *)((long)local_208 + 0xc)) &&
                     (local_f0 != (char *)0x0)) {
                    local_190 = (long)local_138 - (long)local_f0;
                    local_198 = local_190 * 4 +
                                ((ulong)local_208[2] >> ((char)local_190 * '\x06' & 0x3fU) & 0x3f);
                    local_180 = local_228 +
                                (local_198 << (local_138[*local_208] & 0x3fU)) + local_140 + 1;
                    if (local_230 < local_180) {
                      local_124 = 0;
                    }
                    else {
                      local_e0 = local_f0;
                      iVar4 = 0x1f;
                      if ((uint)local_180 != 0) {
                        for (; (uint)local_180 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                        }
                      }
                      local_188 = (char *)(((long)local_f0 * 0x87 + 0x780) -
                                          (ulong)(uint)(iVar4 * 0x1e));
                      local_e8 = local_180;
                      local_b8 = local_180;
                      if (local_188 < local_238[2]) {
                        local_124 = 0;
                      }
                      else {
                        *local_238 = local_f0;
                        *(int *)(local_168 + 3) = (int)local_138 - (int)local_178;
                        local_168[1] = local_180;
                        local_168[2] = local_188;
                        local_124 = 1;
                      }
                    }
                  }
                  else {
                    local_124 = 0;
                  }
                }
                local_254 = local_124;
                if (local_124 != 0) {
                  *(long *)(local_210 + 0x30) = *(long *)(local_210 + 0x30) + 1;
                }
              }
              local_250 = local_250 + 1;
              local_248 = local_248 + 1;
            }
          }
        }
      }
    }
LAB_0237bd61:
    if (0x7e4 < local_9c0) {
      local_9dc = 0;
      do {
        local_9a0 = local_9a0 + -1;
        local_9e8 = 0xaf;
        if (*(int *)(local_940 + 4) < 5) {
          local_890 = local_9d0 + -1;
          local_898 = local_9a0;
          local_a70 = local_890;
          if (local_9a0 <= local_890) {
            local_a70 = local_9a0;
          }
          local_a78 = local_a70;
        }
        else {
          local_a78 = (char *)0x0;
        }
        local_a08 = local_a78;
        local_9f0 = 0;
        local_a00 = (char *)0x0;
        local_9f8 = 0x7e4;
        local_8a0 = local_920 + 1;
        local_8a8 = local_950;
        local_a80 = local_8a0;
        if (local_950 <= local_8a0) {
          local_a80 = local_950;
        }
        local_9a8 = local_a80;
        local_8b0 = local_920 + local_958 + 1;
        local_8b8 = local_950;
        local_a88 = local_8b0;
        if (local_950 <= local_8b0) {
          local_a88 = local_950;
        }
        local_9b0 = local_a88;
        if (*(int *)(local_940 + 0x270) != 0) {
          local_9d6 = local_9d5;
          bVar1 = *(byte *)(local_928 + ((ulong)local_920 & local_930));
          local_9d4 = (uint)*(byte *)(local_940 + 0x275 +
                                     (long)(int)(uint)(*(byte *)(local_938 + (ulong)bVar1) |
                                                      *(byte *)(local_938 + 0x100 + (ulong)local_9d5
                                                               )));
          local_9d5 = bVar1;
        }
        local_5f0 = *(long **)(local_940 + 0x2b8 + (long)(int)local_9d4 * 8);
        local_610 = local_920 + 1;
        local_628 = local_a88 + local_990;
        local_630 = *(char **)(local_940 + 0x48);
        local_5e8 = local_948;
        local_5f8 = local_928;
        local_600 = local_930;
        local_608 = in_stack_00000010;
        local_618 = local_9a0;
        local_620 = local_a80;
        local_638 = &local_a08;
        local_640 = local_948[1];
        local_648 = local_a78;
        local_650 = (ulong)local_610 & local_930;
        local_654 = (uint)(byte)local_a78[local_928 + local_650];
        uVar3 = duckdb_brotli::HashBytesH2((uint8_t *)(local_928 + local_650));
        local_660 = (ulong)uVar3;
        local_668 = local_638[2];
        local_670 = local_638[2];
        local_678 = local_648;
        local_680 = (char *)(long)*local_608;
        local_688 = local_610 + -(long)local_680;
        *(undefined4 *)(local_638 + 3) = 0;
        if ((local_688 < local_610) &&
           (local_688 = (char *)(local_600 & 0xffffffff & (ulong)local_688),
           local_654 == (byte)local_678[local_5f8 + (long)local_688])) {
          local_598 = (ulong *)(local_5f8 + (long)local_688);
          local_588 = (ulong *)(local_5f8 + local_650);
          local_590 = local_618;
          local_580 = local_598;
LAB_0237c200:
          if (local_590 < (char *)0x8) {
            while( true ) {
              bVar10 = false;
              if (local_590 != (char *)0x0) {
                bVar10 = (char)*local_580 == (char)*local_588;
              }
              if (!bVar10) break;
              local_590 = local_590 + -1;
              local_588 = (ulong *)((long)local_588 + 1);
              local_580 = (ulong *)((long)local_580 + 1);
            }
            local_578 = (char *)((long)local_580 - (long)local_598);
          }
          else {
            local_4e8 = local_588;
            local_4f0 = *local_588;
            local_4f8 = local_580;
            local_500 = *local_580;
            local_5a0 = local_4f0 ^ local_500;
            local_588 = local_588 + 1;
            if (local_5a0 == 0) goto LAB_0237c2d2;
            iVar4 = 0;
            for (uVar5 = local_5a0; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
              iVar4 = iVar4 + 1;
            }
            local_5a8 = (ulong)iVar4;
            local_578 = (char *)((long)local_580 + ((local_5a8 >> 3) - (long)local_598));
          }
          local_690 = local_578;
          if (local_578 < (char *)0x4) goto LAB_0237c456;
          local_570 = local_578;
          local_698 = (char *)((long)local_578 * 0x87 + 0x78f);
          if (local_698 <= local_670) goto LAB_0237c456;
          *local_638 = local_578;
          local_638[1] = local_680;
          local_638[2] = local_698;
          *(int *)(local_640 + local_660 * 4) = (int)local_610;
        }
        else {
LAB_0237c456:
          uVar5 = (ulong)*(uint *)(local_640 + local_660 * 4);
          *(int *)(local_640 + local_660 * 4) = (int)local_610;
          local_6a0 = local_610 + -uVar5;
          local_688 = (char *)(local_600 & 0xffffffff & uVar5);
          if ((local_654 == (byte)local_648[local_5f8 + (long)local_688]) &&
             (local_6a0 != (char *)0x0 && local_6a0 <= local_620)) {
            local_5d0 = (ulong *)(local_5f8 + (long)local_688);
            local_5c0 = (ulong *)(local_5f8 + local_650);
            local_5c8 = local_618;
            local_5b8 = local_5d0;
LAB_0237c573:
            if (local_5c8 < (char *)0x8) {
              while( true ) {
                bVar10 = false;
                if (local_5c8 != (char *)0x0) {
                  bVar10 = (char)*local_5b8 == (char)*local_5c0;
                }
                if (!bVar10) break;
                local_5c8 = local_5c8 + -1;
                local_5c0 = (ulong *)((long)local_5c0 + 1);
                local_5b8 = (ulong *)((long)local_5b8 + 1);
              }
              local_5b0 = (char *)((long)local_5b8 - (long)local_5d0);
            }
            else {
              local_4c8 = local_5c0;
              local_4d0 = *local_5c0;
              local_4d8 = local_5b8;
              local_4e0 = *local_5b8;
              local_5d8 = local_4d0 ^ local_4e0;
              local_5c0 = local_5c0 + 1;
              if (local_5d8 == 0) goto LAB_0237c645;
              iVar4 = 0;
              for (uVar5 = local_5d8; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                iVar4 = iVar4 + 1;
              }
              local_5e0 = (ulong)iVar4;
              local_5b0 = (char *)((long)local_5b8 + ((local_5e0 >> 3) - (long)local_5d0));
            }
            local_6a8 = local_5b0;
            if ((char *)0x3 < local_5b0) {
              local_560 = local_5b0;
              iVar4 = 0x1f;
              if ((uint)local_6a0 != 0) {
                for (; (uint)local_6a0 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              local_6b0 = (char *)(((long)local_5b0 * 0x87 + 0x780) - (ulong)(uint)(iVar4 * 0x1e));
              local_568 = local_6a0;
              local_4c0 = local_6a0;
              if (local_670 < local_6b0) {
                *local_638 = local_5b0;
                local_638[1] = local_6a0;
                local_638[2] = local_6b0;
                goto LAB_0237ce91;
              }
            }
            if (local_668 == local_638[2]) {
              local_510 = *local_5e8;
              local_518 = (ulong *)(local_5f8 + local_650);
              local_508 = local_5f0;
              local_520 = local_618;
              local_528 = local_628;
              local_530 = local_630;
              local_538 = local_638;
              local_53c = 1;
              if (*(ulong *)(local_510 + 0x28) >> 7 <= *(ulong *)(local_510 + 0x30)) {
                local_4a4 = (int)*local_518;
                local_4b4 = local_4a4 * 0x1e35a7bd;
                local_548 = (ulong)((local_4b4 >> 0x12) << 1);
                local_550 = 0;
                local_4b0 = local_518;
                local_4a0 = local_518;
                while( true ) {
                  uVar9 = 2;
                  if (local_53c != 0) {
                    uVar9 = 1;
                  }
                  if (uVar9 <= local_550) break;
                  *(long *)(local_510 + 0x28) = *(long *)(local_510 + 0x28) + 1;
                  if (*(char *)(local_508[4] + local_548) != '\0') {
                    local_438 = (char *)(ulong)*(byte *)(local_508[4] + local_548);
                    local_440 = (ulong)*(ushort *)(local_508[3] + local_548 * 2);
                    local_430 = local_508;
                    local_448 = local_518;
                    local_450 = local_520;
                    local_458 = local_528;
                    local_460 = local_530;
                    local_468 = local_538;
                    local_470 = (ulong)*(uint *)(*local_508 + 0x20 + (long)local_438 * 4) +
                                (long)local_438 * local_440;
                    if (local_520 < local_438) {
                      local_424 = 0;
                    }
                    else {
                      local_400 = (ulong *)(*(long *)(*local_508 + 0xa8) + local_470);
                      local_3f8 = local_518;
                      local_410 = local_518;
                      local_408 = local_438;
LAB_0237cab4:
                      if (local_408 < (char *)0x8) {
                        while( true ) {
                          bVar10 = false;
                          if (local_408 != (char *)0x0) {
                            bVar10 = (char)*local_3f8 == (char)*local_400;
                          }
                          if (!bVar10) break;
                          local_408 = local_408 + -1;
                          local_400 = (ulong *)((long)local_400 + 1);
                          local_3f8 = (ulong *)((long)local_3f8 + 1);
                        }
                        local_3f0 = (char *)((long)local_3f8 - (long)local_518);
                      }
                      else {
                        local_3c0 = local_400;
                        local_3c8 = *local_400;
                        local_3d0 = local_3f8;
                        local_3d8 = *local_3f8;
                        local_418 = local_3c8 ^ local_3d8;
                        local_400 = local_400 + 1;
                        if (local_418 == 0) goto LAB_0237cb86;
                        iVar4 = 0;
                        for (uVar5 = local_418; (uVar5 & 1) == 0;
                            uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                          iVar4 = iVar4 + 1;
                        }
                        local_420 = (ulong)iVar4;
                        local_3f0 = (char *)((long)local_3f8 + ((local_420 >> 3) - (long)local_518))
                        ;
                      }
                      local_478 = local_3f0;
                      if ((local_438 < local_3f0 + *(uint *)((long)local_508 + 0xc)) &&
                         (local_3f0 != (char *)0x0)) {
                        local_490 = (long)local_438 - (long)local_3f0;
                        local_498 = local_490 * 4 +
                                    ((ulong)local_508[2] >> ((char)local_490 * '\x06' & 0x3fU) &
                                    0x3f);
                        local_480 = local_528 +
                                    (local_498 << (local_438[*local_508] & 0x3fU)) + local_440 + 1;
                        if (local_530 < local_480) {
                          local_424 = 0;
                        }
                        else {
                          local_3e0 = local_3f0;
                          iVar4 = 0x1f;
                          if ((uint)local_480 != 0) {
                            for (; (uint)local_480 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                            }
                          }
                          local_488 = (char *)(((long)local_3f0 * 0x87 + 0x780) -
                                              (ulong)(uint)(iVar4 * 0x1e));
                          local_3e8 = local_480;
                          local_3b8 = local_480;
                          if (local_488 < local_538[2]) {
                            local_424 = 0;
                          }
                          else {
                            *local_538 = local_3f0;
                            *(int *)(local_468 + 3) = (int)local_438 - (int)local_478;
                            local_468[1] = local_480;
                            local_468[2] = local_488;
                            local_424 = 1;
                          }
                        }
                      }
                      else {
                        local_424 = 0;
                      }
                    }
                    local_554 = local_424;
                    if (local_424 != 0) {
                      *(long *)(local_510 + 0x30) = *(long *)(local_510 + 0x30) + 1;
                    }
                  }
                  local_550 = local_550 + 1;
                  local_548 = local_548 + 1;
                }
              }
            }
          }
        }
LAB_0237ce91:
        pcVar6 = local_920;
        if (local_9f8 < local_9c0 + 0xaf) goto LAB_0237cf49;
        pcVar6 = local_920 + 1;
        local_968 = local_968 + 1;
        local_9d0 = local_a08;
        local_9c8 = local_a00;
        local_9c0 = local_9f8;
        local_9b8 = CONCAT44(uStack_9ec,local_9f0);
        local_9dc = local_9dc + 1;
        if ((3 < local_9dc) || (pcVar7 = local_920 + 9, local_920 = pcVar6, local_970 <= pcVar7))
        goto LAB_0237cf49;
      } while( true );
    }
    local_968 = local_968 + 1;
    pcVar6 = local_920 + 1;
    if (local_988 < pcVar6) {
      if (local_988 + local_980 * 4 < pcVar6) {
        local_7e0 = 7;
        local_7e8 = 4;
        local_8f0 = local_920 + 0x11;
        local_8f8 = local_970 + -7;
        local_920 = pcVar6;
        local_ad8 = local_8f8;
        if (local_8f0 < local_8f8) {
          local_ad8 = local_8f0;
        }
        for (; pcVar6 = local_920, local_920 < local_ad8; local_920 = local_920 + 4) {
          local_10 = local_948;
          local_18 = local_928;
          local_20 = local_930;
          local_28 = local_920;
          local_2c = duckdb_brotli::HashBytesH2
                               ((uint8_t *)(local_928 + ((ulong)local_920 & local_930)));
          *(int *)(local_10[1] + (ulong)local_2c * 4) = (int)local_28;
          local_968 = local_968 + 4;
        }
      }
      else {
        local_7f0 = 7;
        local_7f8 = 2;
        local_900 = local_920 + 9;
        local_908 = local_970 + -7;
        local_920 = pcVar6;
        local_ae8 = local_908;
        if (local_900 < local_908) {
          local_ae8 = local_900;
        }
        for (; pcVar6 = local_920, local_920 < local_ae8; local_920 = local_920 + 2) {
          local_38 = local_948;
          local_40 = local_928;
          local_48 = local_930;
          local_50 = local_920;
          local_54 = duckdb_brotli::HashBytesH2
                               ((uint8_t *)(local_928 + ((ulong)local_920 & local_930)));
          *(int *)(local_38[1] + (ulong)local_54 * 4) = (int)local_50;
          local_968 = local_968 + 2;
        }
      }
    }
  } while( true );
  local_280 = local_280 + 1;
  local_290 = local_290 + -8;
  goto LAB_0237b0a3;
LAB_0237b4fd:
  local_2b8 = local_2b8 + 1;
  local_2c8 = local_2c8 + -8;
  goto LAB_0237b42b;
LAB_0237ba4a:
  local_f8 = local_f8 + 1;
  local_108 = local_108 + -8;
  goto LAB_0237b978;
LAB_0237c2d2:
  local_580 = local_580 + 1;
  local_590 = local_590 + -8;
  goto LAB_0237c200;
LAB_0237c645:
  local_5b8 = local_5b8 + 1;
  local_5c8 = local_5c8 + -8;
  goto LAB_0237c573;
LAB_0237cb86:
  local_3f8 = local_3f8 + 1;
  local_408 = local_408 + -8;
  goto LAB_0237cab4;
LAB_0237cf49:
  local_920 = pcVar6;
  local_988 = local_920 + local_980 + (long)local_9d0 * 2;
  local_8c0 = local_920 + local_958;
  local_8c8 = local_950;
  local_a98 = local_8c0;
  if (local_950 <= local_8c0) {
    local_a98 = local_950;
  }
  local_9b0 = local_a98;
  local_848 = local_a98 + local_990;
  local_840 = local_9c8;
  if (local_9c8 <= local_848) {
    local_858 = local_9c8 + 3;
    local_860 = (long)local_858 - (long)*in_stack_00000010;
    local_868 = (long)local_858 - (long)in_stack_00000010[1];
    if (local_9c8 == (char *)(long)*in_stack_00000010) {
      local_838 = (char *)0x0;
      goto LAB_0237d1a8;
    }
    if (local_9c8 == (char *)(long)in_stack_00000010[1]) {
      local_838 = (char *)0x1;
      goto LAB_0237d1a8;
    }
    if (local_860 < 7) {
      local_838 = (char *)(long)(int)(0x9750468 >> ((byte)((local_860 & 0x3fffffff) << 2) & 0x1f) &
                                     0xf);
      goto LAB_0237d1a8;
    }
    if (local_868 < 7) {
      local_838 = (char *)(long)(int)(0xfdb1ace >> ((byte)((local_868 & 0x3fffffff) << 2) & 0x1f) &
                                     0xf);
      goto LAB_0237d1a8;
    }
    if (local_9c8 == (char *)(long)in_stack_00000010[2]) {
      local_838 = (char *)0x2;
      goto LAB_0237d1a8;
    }
    if (local_9c8 == (char *)(long)in_stack_00000010[3]) {
      local_838 = (char *)0x3;
      goto LAB_0237d1a8;
    }
  }
  local_838 = local_9c8 + 0xf;
LAB_0237d1a8:
  if ((local_9c8 <= local_a98 + local_990) && (local_838 != (char *)0x0)) {
    in_stack_00000010[3] = in_stack_00000010[2];
    in_stack_00000010[2] = in_stack_00000010[1];
    in_stack_00000010[1] = *in_stack_00000010;
    *in_stack_00000010 = (int)local_9c8;
    local_6c8 = local_948;
  }
  local_808 = (uint *)(local_940 + 0x38);
  local_800 = in_stack_00000020;
  local_810 = local_968;
  local_818 = local_9d0;
  local_81c = (uint)local_9b8;
  local_828 = local_838;
  local_82c = (uint)local_9b8 & 0xff;
  *in_stack_00000020 = (int)local_968;
  in_stack_00000020[1] = (uint)local_9d0 | local_82c << 0x19;
  local_778 = (ulong)*(uint *)(local_940 + 0x3c);
  local_780 = (ulong)*local_808;
  local_788 = (ushort *)((long)in_stack_00000020 + 0xe);
  local_790 = in_stack_00000020 + 2;
  local_770 = local_838;
  if (local_838 < (char *)(local_778 + 0x10)) {
    *local_788 = (ushort)local_838;
    *local_790 = 0;
  }
  else {
    bVar1 = (byte)*local_808;
    local_798 = local_838 + (1L << (bVar1 + 2 & 0x3f)) + (-0x10 - local_778);
    iVar4 = 0x1f;
    if ((uint)local_798 != 0) {
      for (; (uint)local_798 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_7a0 = (ulong)(iVar4 - 1U);
    local_7a8 = (ulong)((1 << (bVar1 & 0x1f)) - 1);
    local_7b0 = (ulong)local_798 & local_7a8;
    bVar8 = (byte)(iVar4 - 1U);
    local_7b8 = (ulong)local_798 >> (bVar8 & 0x3f) & 1;
    local_7c0 = local_7b8 + 2 << (bVar8 & 0x3f);
    local_7c8 = local_7a0 - local_780;
    *local_788 = (short)local_7c8 * 0x400 |
                 (short)*(uint *)(local_940 + 0x3c) + 0x10 +
                 (short)((local_7c8 + -1) * 2 + local_7b8 << (bVar1 & 0x3f)) + (short)local_7b0;
    *local_790 = (int)((ulong)((long)local_798 - local_7c0) >> (bVar1 & 0x3f));
    local_768 = local_798;
  }
  iVar4 = (uint)local_9d0 + (uint)local_9b8;
  local_748 = (ulong)iVar4;
  local_74c = (uint)((*(ushort *)((long)in_stack_00000020 + 0xe) & 0x3ff) == 0);
  local_758 = (ushort *)(in_stack_00000020 + 3);
  local_740 = local_968;
  local_730 = local_968;
  if (local_968 < 6) {
    local_722 = (ushort)local_968;
  }
  else if (local_968 < 0x82) {
    local_718 = local_968 - 2;
    local_734 = 0x1f;
    if ((uint)local_718 != 0) {
      for (; (uint)local_718 >> local_734 == 0; local_734 = local_734 + -1) {
      }
    }
    local_734 = local_734 + -1;
    local_722 = (short)local_734 * 2 + (short)(local_968 - 2 >> ((byte)local_734 & 0x3f)) + 2;
  }
  else if (local_968 < 0x842) {
    local_720 = local_968 - 0x42;
    iVar2 = 0x1f;
    if ((uint)local_720 != 0) {
      for (; (uint)local_720 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_722 = (short)iVar2 + 10;
  }
  else if (local_968 < 0x1842) {
    local_722 = 0x15;
  }
  else if (local_968 < 0x5842) {
    local_722 = 0x16;
  }
  else {
    local_722 = 0x17;
  }
  local_75a = local_722;
  if (local_748 < 10) {
    local_6fa = (short)iVar4 - 2;
  }
  else if (local_748 < 0x86) {
    local_6f0 = local_748 - 6;
    local_70c = 0x1f;
    if ((uint)local_6f0 != 0) {
      for (; (uint)local_6f0 >> local_70c == 0; local_70c = local_70c + -1) {
      }
    }
    local_70c = local_70c + -1;
    local_6fa = (short)local_70c * 2 + (short)(local_748 - 6 >> ((byte)local_70c & 0x3f)) + 4;
  }
  else if (local_748 < 0x846) {
    local_6f8 = local_748 - 0x46;
    iVar4 = 0x1f;
    if ((uint)local_6f8 != 0) {
      for (; (uint)local_6f8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_6fa = (short)iVar4 + 0xc;
  }
  else {
    local_6fa = 0x17;
  }
  local_75c = local_6fa;
  local_6d4 = local_722;
  local_6d6 = local_6fa;
  local_6de = local_6fa & 7 | (local_722 & 7) << 3;
  if (((local_74c == 0) || (7 < local_722)) || (0xf < local_6fa)) {
    iVar4 = ((int)(uint)local_6fa >> 3) + ((int)(uint)local_722 >> 3) * 3;
    local_6e4 = iVar4 * 0x40 + 0x40 + (0x520d40U >> ((char)iVar4 * '\x02' & 0x1fU) & 0xc0);
    local_6d2 = (ushort)local_6e4 | local_6de;
  }
  else {
    local_6d2 = local_6de;
    if (7 < local_6fa) {
      local_6d2 = local_6de | 0x40;
    }
  }
  *local_758 = local_6d2;
  *in_stack_00000030 = local_968 + *in_stack_00000030;
  local_968 = 0;
  pcVar6 = local_920 + 2;
  local_8d0 = local_920 + (long)local_9d0;
  local_8d8 = local_978;
  local_ab0 = local_8d0;
  if (local_978 <= local_8d0) {
    local_ab0 = local_978;
  }
  local_a18 = pcVar6;
  if (local_9c8 < (char *)((ulong)local_9d0 >> 2)) {
    local_7d8 = local_920 + (long)local_9d0 + (long)local_9c8 * -4;
    local_ac0 = local_7d8;
    if (local_7d8 < pcVar6) {
      local_ac0 = pcVar6;
    }
    local_8e0 = local_ab0;
    local_8e8 = local_ac0;
    if (local_ab0 < local_ac0) {
      local_ac8 = local_ab0;
    }
    else {
      local_ac8 = local_ac0;
    }
    local_a18 = local_ac8;
    local_7d0 = pcVar6;
  }
  local_88 = local_948;
  local_90 = local_928;
  local_98 = local_930;
  local_a0 = local_a18;
  local_a8 = local_ab0;
  local_708 = local_748;
  local_6dc = local_74c;
  for (local_b0 = local_a18; local_b0 < local_a8; local_b0 = local_b0 + 1) {
    local_60 = local_88;
    local_68 = local_90;
    local_70 = local_98;
    local_78 = local_b0;
    local_7c = duckdb_brotli::HashBytesH2((uint8_t *)(local_90 + ((ulong)local_b0 & local_98)));
    *(int *)(local_60[1] + (ulong)local_7c * 4) = (int)local_78;
  }
  in_stack_00000020 = in_stack_00000020 + 4;
  pcVar6 = local_9d0 + (long)local_920;
  goto LAB_0237abf6;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}